

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

bool __thiscall
ReplayInterface::enqueue_create_graphics_pipeline
          (ReplayInterface *this,Hash hash,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *pipeline)

{
  bool bVar1;
  VkPipeline_T *pVVar2;
  VkGraphicsPipelineCreateInfo *local_38;
  Hash recorded_hash;
  VkPipeline *pipeline_local;
  VkGraphicsPipelineCreateInfo *create_info_local;
  Hash hash_local;
  ReplayInterface *this_local;
  
  recorded_hash = (Hash)pipeline;
  pipeline_local = (VkPipeline *)create_info;
  create_info_local = (VkGraphicsPipelineCreateInfo *)hash;
  hash_local = (Hash)this;
  bVar1 = Fossilize::Hashing::compute_hash_graphics_pipeline
                    (&this->recorder,create_info,(Hash *)&local_38);
  if (bVar1) {
    if (local_38 == create_info_local) {
      pVVar2 = fake_handle<VkPipeline_T*>((uint64_t)create_info_local);
      *(VkPipeline_T **)recorded_hash = pVVar2;
      this_local._7_1_ =
           Fossilize::StateRecorder::record_graphics_pipeline
                     (&this->recorder,*(VkPipeline *)recorded_hash,
                      (VkGraphicsPipelineCreateInfo *)pipeline_local,(VkPipeline *)0x0,0,0,
                      (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_graphics_pipeline(Hash hash, const VkGraphicsPipelineCreateInfo *create_info, VkPipeline *pipeline) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_graphics_pipeline(recorder, *create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*pipeline = fake_handle<VkPipeline>(hash);
		return recorder.record_graphics_pipeline(*pipeline, *create_info, nullptr, 0);
	}